

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrtrns.cpp
# Opt level: O3

UChar * u_strFromJavaModifiedUTF8WithSub_63
                  (UChar *dest,int32_t destCapacity,int32_t *pDestLength,char *src,int32_t srcLength
                  ,UChar32 subchar,int32_t *pNumSubstitutions,UErrorCode *pErrorCode)

{
  uint8_t uVar1;
  uint uVar2;
  int *piVar3;
  byte bVar4;
  int iVar5;
  size_t sVar6;
  long lVar7;
  ulong uVar8;
  UChar UVar9;
  int iVar10;
  int32_t iVar11;
  ulong uVar12;
  UChar *pUVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  uint8_t *puVar17;
  int iVar18;
  UChar *pUVar19;
  uint local_5c;
  UChar *local_58;
  int32_t local_4c;
  UChar *local_48;
  uint local_40;
  int local_3c;
  int *local_38;
  
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (((-2 < srcLength) && (src != (char *)0x0 || srcLength == 0)) &&
       (((subchar < 0x110000 && -1 < destCapacity) && (destCapacity == 0 || dest != (UChar *)0x0))
        && (subchar & 0xfffff800U) != 0xd800)) {
      if (pNumSubstitutions != (int32_t *)0x0) {
        *pNumSubstitutions = 0;
      }
      pUVar19 = dest + (uint)destCapacity;
      iVar11 = destCapacity;
      pUVar13 = dest;
      piVar3 = pDestLength;
      if (srcLength < 0) {
        bVar4 = *src;
        pUVar13 = dest;
        if ('\0' < (char)bVar4 && destCapacity != 0) {
          do {
            *pUVar13 = (ushort)bVar4;
            pUVar13 = pUVar13 + 1;
            bVar4 = ((uint8_t *)src)[1];
            src = (char *)((uint8_t *)src + 1);
            if ((char)bVar4 < '\x01') break;
          } while (pUVar13 < pUVar19);
        }
        if (bVar4 == 0) {
          iVar11 = (int32_t)((ulong)((long)pUVar13 - (long)dest) >> 1);
          if (pDestLength != (int32_t *)0x0) {
            *pDestLength = iVar11;
          }
LAB_002f57c2:
          u_terminateUChars_63(dest,destCapacity,iVar11,pErrorCode);
          return dest;
        }
        local_58 = pUVar19;
        local_4c = destCapacity;
        local_48 = dest;
        local_38 = pDestLength;
        sVar6 = strlen(src);
        srcLength = (int32_t)sVar6;
        dest = pUVar13;
        pUVar19 = local_58;
        iVar11 = local_4c;
        pUVar13 = local_48;
        piVar3 = local_38;
      }
      local_38 = piVar3;
      local_48 = pUVar13;
      local_4c = iVar11;
      local_58 = pUVar19;
      local_5c = 0;
      iVar14 = 0;
      do {
        uVar2 = local_5c;
        iVar5 = (int)((ulong)((long)local_58 - (long)dest) >> 1);
        iVar10 = srcLength - local_5c;
        if (((0 < srcLength) && (iVar10 <= iVar5)) && (-1 < *src)) {
          uVar15 = local_5c;
          if ((int)local_5c < srcLength) {
            puVar17 = (uint8_t *)src + (int)local_5c;
            do {
              uVar15 = local_5c;
              if ((char)*puVar17 < '\0') break;
              *dest = (short)(char)*puVar17;
              dest = dest + 1;
              local_5c = local_5c + 1;
              puVar17 = puVar17 + 1;
              uVar15 = srcLength;
            } while (srcLength != local_5c);
          }
          iVar5 = iVar5 - (uVar15 - uVar2);
          iVar10 = iVar10 - (uVar15 - uVar2);
        }
        if (0xffff < subchar) {
LAB_002f554f:
          uVar8 = (ulong)local_5c;
          iVar5 = 0;
          if (((int)local_5c < srcLength) && (dest < local_58)) {
            local_3c = ((uint)subchar >> 10) - 0x2840;
            local_40 = subchar & 0x3ffU | 0xdc00;
            do {
              iVar5 = 0;
              while( true ) {
                pUVar19 = dest;
                lVar7 = (long)(int)uVar8;
                lVar16 = lVar7 + 1;
                local_5c = (uint)lVar16;
                bVar4 = ((uint8_t *)src)[lVar7];
                if (-1 < (char)bVar4) break;
                if (0xdf < bVar4) {
                  if (((bVar4 < 0xf0) && ((int)(lVar7 + 2) < srcLength)) &&
                     (((byte)(((uint8_t *)src)[lVar16] ^ 0x80) < 0x40 &&
                      ((byte)(((uint8_t *)src)[lVar7 + 2] ^ 0x80) < 0x40)))) {
                    UVar9 = (ushort)bVar4 << 0xc | ((uint8_t *)src)[lVar7 + 2] ^ 0x80 |
                            (((uint8_t *)src)[lVar16] ^ 0x80) << 6;
                    iVar10 = 3;
                    goto LAB_002f5621;
                  }
LAB_002f5648:
                  if (subchar < 0) goto LAB_002f57cc;
                  utf8_nextCharSafeBody_63
                            ((uint8_t *)src,(int32_t *)&local_5c,srcLength,(uint)bVar4,-1);
                  iVar14 = iVar14 + 1;
                  dest = pUVar19 + 1;
                  if ((uint)subchar < 0x10000) {
                    *pUVar19 = (UChar)subchar;
                  }
                  else {
                    *pUVar19 = (UChar)local_3c;
                    if (local_58 <= dest) {
                      uVar8 = (ulong)local_5c;
                      iVar5 = 1;
                      goto LAB_002f56e6;
                    }
                    pUVar19[1] = (UChar)local_40;
                    dest = pUVar19 + 2;
                  }
                  goto LAB_002f56ac;
                }
                if (((bVar4 < 0xc0) || (srcLength <= (int)local_5c)) ||
                   (0x3f < (byte)(((uint8_t *)src)[lVar16] ^ 0x80))) goto LAB_002f5648;
                UVar9 = (ushort)((bVar4 & 0x1f) << 6) | ((uint8_t *)src)[lVar16] ^ 0x80;
                iVar10 = 2;
LAB_002f5621:
                *pUVar19 = UVar9;
                local_5c = (int)uVar8 + iVar10;
                uVar8 = (ulong)local_5c;
                if ((srcLength <= (int)local_5c) || (dest = pUVar19 + 1, local_58 <= pUVar19 + 1)) {
LAB_002f56e6:
                  dest = pUVar19 + 1;
                  goto LAB_002f56e9;
                }
              }
              *pUVar19 = (ushort)bVar4;
              dest = pUVar19 + 1;
LAB_002f56ac:
              iVar5 = 0;
              uVar8 = (ulong)local_5c;
            } while (((int)local_5c < srcLength) && (dest < local_58));
          }
LAB_002f56e9:
          if ((int)uVar8 < srcLength) {
            do {
              uVar12 = uVar8 & 0xffffffff;
              while( true ) {
                iVar10 = iVar5;
                lVar16 = (long)(int)uVar12;
                uVar8 = lVar16 + 1;
                local_5c = (uint)uVar8;
                bVar4 = ((uint8_t *)src)[lVar16];
                if (-1 < (char)bVar4) break;
                if (0xdf < bVar4) {
                  if (((bVar4 < 0xf0) && ((int)(lVar16 + 2) < srcLength)) &&
                     ((char)((uint8_t *)src)[uVar8] < -0x40)) {
                    iVar5 = 3;
                    uVar1 = ((uint8_t *)src)[lVar16 + 2];
                    goto joined_r0x002f5732;
                  }
LAB_002f575d:
                  if (subchar < 0) goto LAB_002f57cc;
                  utf8_nextCharSafeBody_63
                            ((uint8_t *)src,(int32_t *)&local_5c,srcLength,(uint)bVar4,-1);
                  iVar14 = iVar14 + 1;
                  uVar8 = (ulong)local_5c;
                  break;
                }
                if ((bVar4 < 0xc0) || (srcLength <= (int)local_5c)) goto LAB_002f575d;
                iVar5 = 2;
                uVar1 = ((uint8_t *)src)[uVar8];
joined_r0x002f5732:
                if (-0x41 < (char)uVar1) goto LAB_002f575d;
                local_5c = (int)uVar12 + iVar5;
                uVar12 = (ulong)local_5c;
                iVar5 = iVar10 + 1;
                if (srcLength <= (int)local_5c) goto LAB_002f578e;
              }
              iVar5 = iVar10 + 1;
            } while ((int)uVar8 < srcLength);
LAB_002f578e:
            iVar5 = iVar10 + 1;
          }
          if (pNumSubstitutions != (int32_t *)0x0) {
            *pNumSubstitutions = iVar14;
          }
          iVar11 = iVar5 + (int)((ulong)((long)dest - (long)local_48) >> 1);
          dest = local_48;
          destCapacity = local_4c;
          if (local_38 != (int *)0x0) {
            *local_38 = iVar11;
          }
          goto LAB_002f57c2;
        }
        iVar18 = iVar10 / 3;
        if (iVar5 < iVar10 / 3) {
          iVar18 = iVar5;
        }
        if (iVar18 < 3) goto LAB_002f554f;
        iVar18 = iVar18 + 1;
        do {
          lVar7 = (long)(int)local_5c;
          lVar16 = lVar7 + 1;
          bVar4 = ((uint8_t *)src)[lVar7];
          if ((char)bVar4 < '\0') {
            if (bVar4 < 0xe0) {
              if ((bVar4 < 0xc0) || (0x3f < (byte)(((uint8_t *)src)[lVar16] ^ 0x80)))
              goto LAB_002f5514;
              *dest = (ushort)((bVar4 & 0x1f) << 6) | ((uint8_t *)src)[lVar16] ^ 0x80;
              local_5c = local_5c + 2;
            }
            else if (((bVar4 < 0xf0) && ((byte)(((uint8_t *)src)[lVar16] ^ 0x80) < 0x40)) &&
                    ((byte)(((uint8_t *)src)[lVar7 + 2] ^ 0x80) < 0x40)) {
              *dest = (ushort)bVar4 << 0xc | ((uint8_t *)src)[lVar7 + 2] ^ 0x80 |
                      (((uint8_t *)src)[lVar16] ^ 0x80) << 6;
              local_5c = local_5c + 3;
            }
            else {
LAB_002f5514:
              if (subchar < 0) {
LAB_002f57cc:
                *pErrorCode = U_INVALID_CHAR_FOUND;
                return (UChar *)0x0;
              }
              local_5c = (uint)lVar16;
              utf8_nextCharSafeBody_63((uint8_t *)src,(int32_t *)&local_5c,srcLength,(uint)bVar4,-1)
              ;
              iVar14 = iVar14 + 1;
              *dest = (UChar)subchar;
            }
          }
          else {
            *dest = (ushort)bVar4;
            local_5c = (uint)lVar16;
          }
          dest = dest + 1;
          iVar18 = iVar18 + -1;
        } while (1 < iVar18);
      } while( true );
    }
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return (UChar *)0x0;
}

Assistant:

U_CAPI UChar* U_EXPORT2
u_strFromJavaModifiedUTF8WithSub(
        UChar *dest,
        int32_t destCapacity,
        int32_t *pDestLength,
        const char *src,
        int32_t srcLength,
        UChar32 subchar, int32_t *pNumSubstitutions,
        UErrorCode *pErrorCode) {
    /* args check */
    if(U_FAILURE(*pErrorCode)) {
        return NULL;
    }
    if( (src==NULL && srcLength!=0) || srcLength < -1 ||
        (dest==NULL && destCapacity!=0) || destCapacity<0 ||
        subchar > 0x10ffff || U_IS_SURROGATE(subchar)
    ) {
        *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }

    if(pNumSubstitutions!=NULL) {
        *pNumSubstitutions=0;
    }
    UChar *pDest = dest;
    UChar *pDestLimit = dest+destCapacity;
    int32_t reqLength = 0;
    int32_t numSubstitutions=0;

    if(srcLength < 0) {
        /*
         * Transform a NUL-terminated ASCII string.
         * Handle non-ASCII strings with slower code.
         */
        UChar32 c;
        while(((c = (uint8_t)*src) != 0) && c <= 0x7f && (pDest < pDestLimit)) {
            *pDest++=(UChar)c;
            ++src;
        }
        if(c == 0) {
            reqLength=(int32_t)(pDest - dest);
            if(pDestLength) {
                *pDestLength = reqLength;
            }

            /* Terminate the buffer */
            u_terminateUChars(dest, destCapacity, reqLength, pErrorCode);
            return dest;
        }
        srcLength = static_cast<int32_t>(uprv_strlen(src));
    }

    /* Faster loop without ongoing checking for srcLength and pDestLimit. */
    UChar32 ch;
    uint8_t t1, t2;
    int32_t i = 0;
    for(;;) {
        int32_t count = (int32_t)(pDestLimit - pDest);
        int32_t count2 = srcLength - i;
        if(count >= count2 && srcLength > 0 && U8_IS_SINGLE(*src)) {
            /* fast ASCII loop */
            int32_t start = i;
            uint8_t b;
            while(i < srcLength && U8_IS_SINGLE(b = src[i])) {
                *pDest++=b;
                ++i;
            }
            int32_t delta = i - start;
            count -= delta;
            count2 -= delta;
        }
        /*
         * Each iteration of the inner loop progresses by at most 3 UTF-8
         * bytes and one UChar.
         */
        if(subchar > 0xFFFF) {
            break;
        }
        count2 /= 3;
        if(count > count2) {
            count = count2; /* min(remaining dest, remaining src/3) */
        }
        if(count < 3) {
            /*
             * Too much overhead if we get near the end of the string,
             * continue with the next loop.
             */
            break;
        }
        do {
            ch = (uint8_t)src[i++];
            if(U8_IS_SINGLE(ch)) {
                *pDest++=(UChar)ch;
            } else {
                if(ch >= 0xe0) {
                    if( /* handle U+0000..U+FFFF inline */
                        ch <= 0xef &&
                        (t1 = (uint8_t)(src[i] - 0x80)) <= 0x3f &&
                        (t2 = (uint8_t)(src[i+1] - 0x80)) <= 0x3f
                    ) {
                        /* no need for (ch & 0xf) because the upper bits are truncated after <<12 in the cast to (UChar) */
                        *pDest++ = (UChar)((ch << 12) | (t1 << 6) | t2);
                        i += 2;
                        continue;
                    }
                } else {
                    if( /* handle U+0000..U+07FF inline */
                        ch >= 0xc0 &&
                        (t1 = (uint8_t)(src[i] - 0x80)) <= 0x3f
                    ) {
                        *pDest++ = (UChar)(((ch & 0x1f) << 6) | t1);
                        ++i;
                        continue;
                    }
                }

                if(subchar < 0) {
                    *pErrorCode = U_INVALID_CHAR_FOUND;
                    return NULL;
                } else if(subchar > 0xffff && --count == 0) {
                    /*
                     * We need to write two UChars, adjusted count for that,
                     * and ran out of space.
                     */
                    --i;  // back out byte ch
                    break;
                } else {
                    /* function call for error cases */
                    utf8_nextCharSafeBody((const uint8_t *)src, &(i), srcLength, ch, -1);
                    ++numSubstitutions;
                    *(pDest++)=(UChar)subchar;
                }
            }
        } while(--count > 0);
    }

    while(i < srcLength && (pDest < pDestLimit)) {
        ch = (uint8_t)src[i++];
        if(U8_IS_SINGLE(ch)){
            *pDest++=(UChar)ch;
        } else {
            if(ch >= 0xe0) {
                if( /* handle U+0000..U+FFFF inline */
                    ch <= 0xef &&
                    (i+1) < srcLength &&
                    (t1 = (uint8_t)(src[i] - 0x80)) <= 0x3f &&
                    (t2 = (uint8_t)(src[i+1] - 0x80)) <= 0x3f
                ) {
                    /* no need for (ch & 0xf) because the upper bits are truncated after <<12 in the cast to (UChar) */
                    *pDest++ = (UChar)((ch << 12) | (t1 << 6) | t2);
                    i += 2;
                    continue;
                }
            } else {
                if( /* handle U+0000..U+07FF inline */
                    ch >= 0xc0 &&
                    i < srcLength &&
                    (t1 = (uint8_t)(src[i] - 0x80)) <= 0x3f
                ) {
                    *pDest++ = (UChar)(((ch & 0x1f) << 6) | t1);
                    ++i;
                    continue;
                }
            }

            if(subchar < 0) {
                *pErrorCode = U_INVALID_CHAR_FOUND;
                return NULL;
            } else {
                /* function call for error cases */
                utf8_nextCharSafeBody((const uint8_t *)src, &(i), srcLength, ch, -1);
                ++numSubstitutions;
                if(subchar<=0xFFFF) {
                    *(pDest++)=(UChar)subchar;
                } else {
                    *(pDest++)=U16_LEAD(subchar);
                    if(pDest<pDestLimit) {
                        *(pDest++)=U16_TRAIL(subchar);
                    } else {
                        reqLength++;
                        break;
                    }
                }
            }
        }
    }

    /* Pre-flight the rest of the string. */
    while(i < srcLength) {
        ch = (uint8_t)src[i++];
        if(U8_IS_SINGLE(ch)) {
            reqLength++;
        } else {
            if(ch >= 0xe0) {
                if( /* handle U+0000..U+FFFF inline */
                    ch <= 0xef &&
                    (i+1) < srcLength &&
                    (uint8_t)(src[i] - 0x80) <= 0x3f &&
                    (uint8_t)(src[i+1] - 0x80) <= 0x3f
                ) {
                    reqLength++;
                    i += 2;
                    continue;
                }
            } else {
                if( /* handle U+0000..U+07FF inline */
                    ch >= 0xc0 &&
                    i < srcLength &&
                    (uint8_t)(src[i] - 0x80) <= 0x3f
                ) {
                    reqLength++;
                    ++i;
                    continue;
                }
            }

            if(subchar < 0) {
                *pErrorCode = U_INVALID_CHAR_FOUND;
                return NULL;
            } else {
                /* function call for error cases */
                utf8_nextCharSafeBody((const uint8_t *)src, &(i), srcLength, ch, -1);
                ++numSubstitutions;
                reqLength+=U16_LENGTH(ch);
            }
        }
    }

    if(pNumSubstitutions!=NULL) {
        *pNumSubstitutions=numSubstitutions;
    }

    reqLength+=(int32_t)(pDest - dest);
    if(pDestLength) {
        *pDestLength = reqLength;
    }

    /* Terminate the buffer */
    u_terminateUChars(dest, destCapacity, reqLength, pErrorCode);
    return dest;
}